

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcIvy.c
# Opt level: O2

Ivy_Man_t * Abc_NtkToIvy(Abc_Ntk_t *pNtkOld)

{
  char cVar1;
  uint uVar2;
  Abc_Ntk_t *pAVar3;
  void **ppvVar4;
  int *piVar5;
  void *pvVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  Ivy_Man_t *p;
  Abc_Obj_t *pAVar10;
  Vec_Ptr_t *p_00;
  Mio_Gate_t *pGate;
  anon_union_8_4_617c9805_for_Abc_Obj_t__17 aVar11;
  Ivy_Obj_t *pIVar12;
  Dec_Graph_t *pGraph;
  long lVar13;
  Ivy_Obj_t *p1;
  anon_union_8_4_617c9805_for_Abc_Obj_t__17 p0;
  long lVar14;
  int iVar15;
  Mio_Gate_t *pMVar16;
  
  if ((pNtkOld->ntkFunc != ABC_FUNC_SOP) && (pNtkOld->ntkType != ABC_NTK_STRASH)) {
    __assert_fail("Abc_NtkHasSop(pNtkOld) || Abc_NtkIsStrash(pNtkOld)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcIvy.c"
                  ,0x388,"Ivy_Man_t *Abc_NtkToIvy(Abc_Ntk_t *)");
  }
  p = Ivy_ManStart();
  iVar15 = 0;
  if (pNtkOld->ntkType == ABC_NTK_STRASH) {
    aVar11 = (anon_union_8_4_617c9805_for_Abc_Obj_t__17)p->pConst1;
    pAVar10 = Abc_AigConst1(pNtkOld);
    pAVar10->field_6 = aVar11;
    iVar15 = 0;
  }
  for (; iVar15 < pNtkOld->vCis->nSize; iVar15 = iVar15 + 1) {
    pAVar10 = Abc_NtkCi(pNtkOld,iVar15);
    pIVar12 = Ivy_ObjCreatePi(p);
    (pAVar10->field_6).pCopy = (Abc_Obj_t *)pIVar12;
  }
  iVar15 = 0;
  p_00 = Abc_NtkDfs(pNtkOld,0);
  do {
    if (p_00->nSize <= iVar15) {
      Vec_PtrFree(p_00);
      for (iVar15 = 0; iVar15 < pNtkOld->vCos->nSize; iVar15 = iVar15 + 1) {
        pAVar10 = Abc_NtkCo(pNtkOld,iVar15);
        Ivy_ObjCreatePo(p,(Ivy_Obj_t *)
                          ((ulong)(*(uint *)&pAVar10->field_0x14 >> 10 & 1) ^
                          *(ulong *)((long)pAVar10->pNtk->vObjs->pArray[*(pAVar10->vFanins).pArray]
                                    + 0x40)));
      }
      Ivy_ManCleanup(p);
      return p;
    }
    pAVar10 = (Abc_Obj_t *)Vec_PtrEntry(p_00,iVar15);
    uVar2 = *(uint *)&pAVar10->field_0x14;
    if ((uVar2 & 0xf) != 7) {
      __assert_fail("Abc_ObjIsNode(pNode)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcIvy.c"
                    ,0x3c9,"Ivy_Obj_t *Abc_NodeStrashAig(Ivy_Man_t *, Abc_Obj_t *)");
    }
    pAVar3 = pAVar10->pNtk;
    if (pAVar3->ntkType == ABC_NTK_STRASH) {
      if (**(int **)((ulong)pAVar10 & 0xfffffffffffffffe) != 3) {
        __assert_fail("Abc_NtkIsStrash(Abc_ObjRegular(pNode)->pNtk)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abc.h"
                      ,0x18e,"int Abc_AigNodeIsConst(Abc_Obj_t *)");
      }
      if ((*(uint *)((long)((ulong)pAVar10 & 0xfffffffffffffffe) + 0x14) & 0xf) == 1) {
        aVar11 = (anon_union_8_4_617c9805_for_Abc_Obj_t__17)p->pConst1;
      }
      else {
        ppvVar4 = pAVar3->vObjs->pArray;
        piVar5 = (pAVar10->vFanins).pArray;
        aVar11.pCopy = (Abc_Obj_t *)
                       Ivy_And(p,(Ivy_Obj_t *)
                                 ((ulong)(uVar2 >> 10 & 1) ^
                                 *(ulong *)((long)ppvVar4[*piVar5] + 0x40)),
                               (Ivy_Obj_t *)
                               ((ulong)(uVar2 >> 0xb & 1) ^
                               *(ulong *)((long)ppvVar4[piVar5[1]] + 0x40)));
      }
    }
    else {
      pGate = (Mio_Gate_t *)(pAVar10->field_5).pData;
      if (pAVar3->ntkFunc == ABC_FUNC_MAP) {
        pGate = (Mio_Gate_t *)Mio_GateReadSop(pGate);
      }
      iVar7 = Abc_NodeIsConst(pAVar10);
      if (iVar7 == 0) {
        if ((((pAVar10->vFanins).nSize < 3) || (iVar7 = Abc_SopGetCubeNum((char *)pGate), iVar7 < 2)
            ) || (iVar7 = Abc_SopIsExorType((char *)pGate), iVar7 != 0)) {
          iVar8 = Abc_SopIsExorType((char *)pGate);
          iVar7 = (pAVar10->vFanins).nSize;
          iVar9 = Abc_SopGetVarNum((char *)pGate);
          if (iVar7 != iVar9) {
            __assert_fail("nFanins == Abc_SopGetVarNum(pSop)",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcIvy.c"
                          ,0x3fc,
                          "Ivy_Obj_t *Abc_NodeStrashAigSopAig(Ivy_Man_t *, Abc_Obj_t *, char *)");
          }
          p0.pTemp = (void *)((ulong)p->pConst1 ^ 1);
          for (pMVar16 = pGate; *(char *)&pMVar16->pName != '\0';
              pMVar16 = (Mio_Gate_t *)((long)&pMVar16->pName + (long)iVar7 + 3)) {
            pIVar12 = p->pConst1;
            for (lVar14 = 0; lVar14 < (pAVar10->vFanins).nSize; lVar14 = lVar14 + 1) {
              pvVar6 = pAVar10->pNtk->vObjs->pArray[(pAVar10->vFanins).pArray[lVar14]];
              cVar1 = *(char *)((long)&pMVar16->pName + lVar14);
              if (cVar1 == '0') {
                p1 = (Ivy_Obj_t *)(*(ulong *)((long)pvVar6 + 0x40) ^ 1);
LAB_002514b4:
                pIVar12 = Ivy_And(p,pIVar12,p1);
              }
              else if (cVar1 == '1') {
                p1 = *(Ivy_Obj_t **)((long)pvVar6 + 0x40);
                goto LAB_002514b4;
              }
            }
            if (iVar8 == 0) {
              p0.pTemp = Ivy_Or(p,p0.pTemp,pIVar12);
            }
            else {
              p0.pTemp = Ivy_Exor(p,p0.pTemp,pIVar12);
            }
          }
          iVar7 = Abc_SopIsComplement((char *)pGate);
          aVar11.pTemp = p0.pTemp ^ 1;
          if (iVar7 == 0) {
            aVar11 = p0;
          }
        }
        else {
          pGraph = Dec_Factor((char *)pGate);
          lVar14 = 2;
          for (lVar13 = 0; lVar13 < pGraph->nLeaves; lVar13 = lVar13 + 1) {
            *(undefined8 *)(&pGraph->pNodes->eEdge0 + lVar14) =
                 *(undefined8 *)
                  ((long)pAVar10->pNtk->vObjs->pArray[(pAVar10->vFanins).pArray[lVar13]] + 0x40);
            lVar14 = lVar14 + 6;
          }
          aVar11.pCopy = (Abc_Obj_t *)Dec_GraphToNetworkIvy(p,pGraph);
          free(pGraph->pNodes);
          free(pGraph);
        }
      }
      else {
        pIVar12 = p->pConst1;
        iVar7 = Abc_SopIsConst0((char *)pGate);
        aVar11.pTemp = (void *)((long)iVar7 ^ (ulong)pIVar12);
      }
    }
    pAVar10->field_6 = aVar11;
    iVar15 = iVar15 + 1;
  } while( true );
}

Assistant:

Ivy_Man_t * Abc_NtkToIvy( Abc_Ntk_t * pNtkOld )
{
    Ivy_Man_t * pMan;
    Abc_Obj_t * pObj;
    Ivy_Obj_t * pFanin;
    int i;
    // create the manager
    assert( Abc_NtkHasSop(pNtkOld) || Abc_NtkIsStrash(pNtkOld) );
    pMan = Ivy_ManStart();
    // create the PIs
    if ( Abc_NtkIsStrash(pNtkOld) )
        Abc_AigConst1(pNtkOld)->pCopy = (Abc_Obj_t *)Ivy_ManConst1(pMan);
    Abc_NtkForEachCi( pNtkOld, pObj, i )
        pObj->pCopy = (Abc_Obj_t *)Ivy_ObjCreatePi(pMan);
    // perform the conversion of the internal nodes
    Abc_NtkStrashPerformAig( pNtkOld, pMan );
    // create the POs
    Abc_NtkForEachCo( pNtkOld, pObj, i )
    {
        pFanin = (Ivy_Obj_t *)Abc_ObjFanin0(pObj)->pCopy;
        pFanin = Ivy_NotCond( pFanin, Abc_ObjFaninC0(pObj) );
        Ivy_ObjCreatePo( pMan, pFanin );
    }
    Ivy_ManCleanup( pMan );
    return pMan;
}